

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O1

void sortSetData(HighsInt num_entries,vector<int,_std::allocator<int>_> *set,double *data0,
                double *data1,double *data2,double *sorted_data0,double *sorted_data1,
                double *sorted_data2)

{
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> perm_vec;
  vector<int,_std::allocator<int>_> sort_set_vec;
  allocator_type local_71;
  vector<int,_std::allocator<int>_> *local_70;
  ulong local_68;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if (0 < num_entries) {
    local_70 = set;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_48,(ulong)(num_entries + 1),(allocator_type *)&local_60);
    std::vector<int,_std::allocator<int>_>::vector(&local_60,(ulong)(num_entries + 1),&local_71);
    piVar3 = local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar2 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar1 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 + 1] = piVar1[uVar4];
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar4 + 1] = (HighsInt)uVar4;
      uVar4 = uVar4 + 1;
    } while ((uint)num_entries != uVar4);
    local_68 = (ulong)(uint)num_entries;
    maxheapsort(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,num_entries);
    piVar1 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 1;
    if (1 < (int)local_68) {
      uVar4 = local_68 & 0xffffffff;
    }
    lVar5 = 0;
    do {
      *(undefined4 *)((long)piVar1 + lVar5) = *(undefined4 *)((long)piVar3 + lVar5 + 4);
      if (data0 != (double *)0x0) {
        *(double *)((long)sorted_data0 + lVar5 * 2) = data0[*(int *)((long)piVar2 + lVar5 + 4)];
      }
      if (data1 != (double *)0x0) {
        *(double *)((long)sorted_data1 + lVar5 * 2) = data1[*(int *)((long)piVar2 + lVar5 + 4)];
      }
      if (data2 != (double *)0x0) {
        *(double *)((long)sorted_data2 + lVar5 * 2) = data2[*(int *)((long)piVar2 + lVar5 + 4)];
      }
      lVar5 = lVar5 + 4;
    } while (uVar4 * 4 != lVar5);
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (HighsInt *)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (HighsInt *)0x0) {
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void sortSetData(const HighsInt num_entries, vector<HighsInt>& set,
                 const double* data0, const double* data1, const double* data2,
                 double* sorted_data0, double* sorted_data1,
                 double* sorted_data2) {
  if (num_entries <= 0) return;
  vector<HighsInt> sort_set_vec(1 + num_entries);
  vector<HighsInt> perm_vec(1 + num_entries);

  HighsInt* sort_set = sort_set_vec.data();
  HighsInt* perm = perm_vec.data();

  for (HighsInt ix = 0; ix < num_entries; ix++) {
    sort_set[1 + ix] = set[ix];
    perm[1 + ix] = ix;
  }
  maxheapsort(sort_set, perm, num_entries);
  for (HighsInt ix = 0; ix < num_entries; ix++) {
    set[ix] = sort_set[1 + ix];
    if (data0 != NULL) sorted_data0[ix] = data0[perm[1 + ix]];
    if (data1 != NULL) sorted_data1[ix] = data1[perm[1 + ix]];
    if (data2 != NULL) sorted_data2[ix] = data2[perm[1 + ix]];
  }
}